

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_noDict_4
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  long lVar6;
  U32 UVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint *puVar17;
  ulong *puVar18;
  BYTE *pBVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  BYTE *pInLoopLimit;
  uint local_d4;
  ulong local_d0;
  uint *local_b0;
  uint local_74;
  BYTE *local_70;
  ZSTD_matchState_t *local_68;
  BYTE *local_60;
  ulong *local_58;
  ulong *local_50;
  ZSTD_match_t *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_48 = matches;
  if ((ms->cParams).minMatch != 4) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar19 = (ms->window).base;
  uVar26 = (ulong)ms->nextToUpdate;
  UVar7 = 0;
  if (pBVar19 + uVar26 <= ip) {
    local_68 = ms;
    while( true ) {
      uVar29 = (uint)uVar26;
      uVar14 = (uint)((long)ip - (long)pBVar19);
      if (uVar14 <= uVar29) break;
      UVar7 = ZSTD_insertBt1(ms,pBVar19 + uVar26,iHighLimit,uVar14,4,0);
      uVar26 = (ulong)(UVar7 + uVar29);
      if (UVar7 + uVar29 <= uVar29) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x236,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar19) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x239,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar19) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x23a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar14;
    uVar14 = (ms->cParams).targetLength;
    uVar29 = 0xfff;
    if (uVar14 < 0xfff) {
      uVar29 = uVar14;
    }
    uVar14 = (ms->cParams).hashLog;
    if (0x20 < uVar14) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_60 = (ms->window).base;
    uVar27 = (int)ip - (int)local_60;
    uVar30 = (uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar14 & 0x1fU);
    uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar14 = (ms->window).lowLimit;
    uVar26 = 0;
    uVar13 = uVar27 - uVar22;
    if (uVar27 < uVar22) {
      uVar13 = 0;
    }
    uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar20 = uVar27 - uVar21;
    if (uVar27 - uVar14 <= uVar21) {
      uVar20 = uVar14;
    }
    if (ms->loadedDictEnd != 0) {
      uVar20 = uVar14;
    }
    uVar14 = uVar20 + (uVar20 == 0);
    uVar21 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x27a,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    pUVar5 = ms->hashTable;
    uVar3 = pUVar5[uVar30];
    local_38 = ms->chainTable;
    uVar4 = (ms->window).dictLimit;
    uVar23 = (ulong)((uVar22 & uVar27) * 2);
    local_b0 = local_38 + uVar23;
    puVar17 = local_38 + uVar23 + 1;
    local_d4 = uVar27 + 9;
    local_d0 = (ulong)(lengthToBeat - 1);
    puVar1 = (ulong *)(ip + 4);
    puVar2 = (ulong *)(iHighLimit + -7);
    local_50 = (ulong *)(iHighLimit + -3);
    local_58 = (ulong *)(iHighLimit + -1);
    uVar23 = (ulong)ll0;
    do {
      if (uVar23 == 3) {
        uVar15 = *rep - 1;
      }
      else {
        uVar15 = rep[uVar23];
      }
      if (uVar27 < uVar4) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x281,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (uVar15 - 1 < uVar27 - uVar4) {
        uVar25 = 0;
        if ((uVar20 <= uVar27 - uVar15) && (*(int *)ip == *(int *)(ip + -(ulong)uVar15))) {
          lVar28 = -(ulong)uVar15;
          puVar18 = (ulong *)((long)puVar1 + lVar28);
          puVar11 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar18 == *puVar1) {
              lVar28 = lVar28 + 0xc;
              lVar16 = 0;
              do {
                puVar11 = (ulong *)(ip + lVar16 + 0xc);
                if (puVar2 <= puVar11) {
                  puVar18 = (ulong *)(ip + lVar16 + lVar28);
                  goto LAB_006dabc0;
                }
                lVar6 = lVar16 + lVar28;
                lVar16 = lVar16 + 8;
              } while (*(ulong *)(ip + lVar6) == *puVar11);
              uVar24 = *puVar11 ^ *(ulong *)(ip + lVar6);
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar15 = ((uint)(uVar25 >> 3) & 0x1fffffff) + (int)lVar16;
            }
            else {
              uVar24 = *puVar1 ^ *puVar18;
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar15 = (uint)(uVar25 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_006dabc0:
            if ((puVar11 < local_50) && ((int)*puVar18 == (int)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar11 < local_58) && ((short)*puVar18 == (short)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar11 < iHighLimit) {
              puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar18 == (char)*puVar11));
            }
            uVar15 = (int)puVar11 - (int)puVar1;
          }
          uVar25 = (ulong)(uVar15 + 4);
        }
      }
      else {
        uVar25 = 0;
        if (uVar27 < uVar20) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x28d,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
      }
      if (local_d0 < uVar25) {
        local_48[uVar26].off = ((int)uVar23 - ll0) + 1;
        local_48[uVar26].len = (uint)uVar25;
        uVar15 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar15;
        if (uVar29 < (uint)uVar25) {
          return uVar15;
        }
        local_d0 = uVar25;
        if (ip + uVar25 == iHighLimit) {
          return uVar15;
        }
      }
      uVar23 = uVar23 + 1;
    } while (ll0 + 3 != (int)uVar23);
    pUVar5[uVar30] = uVar27;
    if (uVar14 <= uVar3) {
      local_70 = local_60 + 8;
      local_40 = ip + 8;
      uVar25 = 0;
      uVar23 = 0;
      do {
        uVar24 = uVar23;
        if (uVar25 < uVar23) {
          uVar24 = uVar25;
        }
        if (uVar27 <= uVar3) {
          __assert_fail("curr > matchIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2cd,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar10 = uVar24 + uVar3;
        if (uVar10 < uVar4) {
          __assert_fail("matchIndex+matchLength >= dictLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2d0,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        pBVar19 = local_60 + uVar3;
        if ((uVar4 <= uVar3) && (iVar8 = bcmp(pBVar19,ip,uVar24), iVar8 != 0)) {
          __assert_fail("memcmp(match, ip, matchLength) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2d2,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        puVar1 = (ulong *)(ip + uVar24);
        puVar18 = (ulong *)(pBVar19 + uVar24);
        puVar11 = puVar1;
        if (puVar1 < puVar2) {
          if (*puVar18 == *puVar1) {
            lVar28 = 0;
            do {
              puVar11 = (ulong *)(local_40 + lVar28 + uVar24);
              if (puVar2 <= puVar11) {
                puVar18 = (ulong *)(local_70 + uVar10 + lVar28);
                goto LAB_006dae27;
              }
              lVar16 = lVar28 + uVar10;
              lVar28 = lVar28 + 8;
            } while (*(ulong *)(local_70 + lVar16) == *puVar11);
            uVar9 = *puVar11 ^ *(ulong *)(local_70 + lVar16);
            uVar10 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar10 = (uVar10 >> 3 & 0x1fffffff) + lVar28;
          }
          else {
            uVar9 = *puVar1 ^ *puVar18;
            uVar10 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar10 = uVar10 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_006dae27:
          if ((puVar11 < local_50) && ((int)*puVar18 == (int)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 4);
            puVar18 = (ulong *)((long)puVar18 + 4);
          }
          if ((puVar11 < local_58) && ((short)*puVar18 == (short)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 2);
            puVar18 = (ulong *)((long)puVar18 + 2);
          }
          if (puVar11 < iHighLimit) {
            puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar18 == (char)*puVar11));
          }
          uVar10 = (long)puVar11 - (long)puVar1;
        }
        uVar10 = uVar10 + uVar24;
        if (local_d0 < uVar10) {
          if (local_d4 < uVar3 || local_d4 - uVar3 == 0) {
            __assert_fail("matchEndIdx > matchIndex",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x2df,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_d4 - uVar3 < uVar10) {
            local_d4 = uVar3 + (U32)uVar10;
          }
          local_48[uVar26].off = (uVar27 + 3) - uVar3;
          local_48[uVar26].len = (U32)uVar10;
          uVar26 = (ulong)((int)uVar26 + 1);
          if ((0x1000 < uVar10) || (local_d0 = uVar10, ip + uVar10 == iHighLimit)) break;
        }
        puVar12 = local_38 + (uVar3 & uVar22) * 2;
        if (pBVar19[uVar10] < ip[uVar10]) {
          *local_b0 = uVar3;
          if (uVar3 <= uVar13) {
            local_b0 = &local_74;
            break;
          }
          puVar12 = puVar12 + 1;
          uVar25 = uVar10;
          local_b0 = puVar12;
        }
        else {
          *puVar17 = uVar3;
          puVar17 = puVar12;
          uVar23 = uVar10;
          if (uVar3 <= uVar13) {
            puVar17 = &local_74;
            break;
          }
        }
        uVar21 = uVar21 - 1;
        if ((uVar21 == 0) || (uVar3 = *puVar12, uVar3 < uVar14)) break;
      } while( true );
    }
    UVar7 = (U32)uVar26;
    *puVar17 = 0;
    *local_b0 = 0;
    if (0x40000000 < uVar21) {
      __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2fd,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_d4 <= uVar27 + 8) {
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x324,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_68->nextToUpdate = local_d4 - 8;
  }
  return UVar7;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}